

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O3

void lrit::to_json(json *j,RiceCompressionHeader *h)

{
  value_t t;
  json_value jVar1;
  long lVar2;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  undefined1 local_158 [8];
  json_value local_150;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_148;
  value_t local_128 [8];
  ulong local_120;
  value_t *local_118;
  undefined1 local_110;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_108;
  value_t local_e8 [8];
  ulong local_e0;
  value_t *local_d8;
  undefined1 local_d0;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_c8;
  value_t local_a8 [8];
  ulong local_a0;
  value_t *local_98;
  undefined1 local_90;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_68;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_58;
  undefined1 local_50;
  undefined1 local_48 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_38;
  undefined1 local_30;
  
  local_c8.owned_value.m_type = string;
  local_c8.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])"Flags");
  local_c8.is_rvalue = true;
  local_98 = local_a8;
  local_a0 = (ulong)h->flags;
  local_a8[0] = number_integer;
  local_90 = 1;
  init._M_len = 2;
  init._M_array = &local_c8;
  local_c8.value_ref = &local_c8.owned_value;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_88.owned_value,init,true,array);
  local_88.value_ref = &local_88.owned_value;
  local_88.is_rvalue = true;
  local_108.owned_value.m_type = string;
  local_108.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[15]>((char (*) [15])"PixelsPerBlock");
  local_108.value_ref = &local_108.owned_value;
  local_108.is_rvalue = true;
  local_d8 = local_e8;
  local_e0 = (ulong)h->pixelsPerBlock;
  local_e8[0] = number_integer;
  local_d0 = 1;
  init_00._M_len = 2;
  init_00._M_array = (iterator)local_108.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_68,init_00,true,array);
  local_50 = 1;
  local_148.owned_value.m_type = string;
  local_58 = &local_68;
  local_148.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[19]>((char (*) [19])"ScanLinesPerPacket");
  local_148.value_ref = &local_148.owned_value;
  local_148.is_rvalue = true;
  local_118 = local_128;
  local_120 = (ulong)h->scanLinesPerPacket;
  local_128[0] = number_integer;
  local_110 = 1;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_148.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_48,init_01,true,array);
  local_30 = 1;
  init_02._M_len = 3;
  init_02._M_array = &local_88;
  local_38 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_48;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_158,init_02,true,array);
  t = j->m_type;
  j->m_type = local_158[0];
  jVar1 = j->m_value;
  j->m_value = local_150;
  local_158[0] = t;
  local_150 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_158 + 8),t);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_48 + lVar2 + 8),local_48[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x60);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_120 + lVar2),local_128[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_e0 + lVar2),local_e8[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_a0 + lVar2),local_a8[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return;
}

Assistant:

void to_json(json& j, const RiceCompressionHeader& h) {
  j = {
      {"Flags", int(h.flags)},
      {"PixelsPerBlock", int(h.pixelsPerBlock)},
      {"ScanLinesPerPacket", int(h.scanLinesPerPacket)},
  };
}